

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_helper.c
# Opt level: O0

int nghttp2_check_method(uint8_t *value,size_t len)

{
  uint8_t *last;
  size_t len_local;
  uint8_t *value_local;
  
  if (len == 0) {
    value_local._4_4_ = 0;
  }
  else {
    for (len_local = (size_t)value; (uint8_t *)len_local != value + len; len_local = len_local + 1)
    {
      if (VALID_METHOD_CHARS[*(byte *)len_local] == '\0') {
        return 0;
      }
    }
    value_local._4_4_ = 1;
  }
  return value_local._4_4_;
}

Assistant:

int nghttp2_check_method(const uint8_t *value, size_t len) {
  const uint8_t *last;
  if (len == 0) {
    return 0;
  }
  for (last = value + len; value != last; ++value) {
    if (!VALID_METHOD_CHARS[*value]) {
      return 0;
    }
  }
  return 1;
}